

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O2

MXFWriter * __thiscall
ASDCP::ATMOS::MXFWriter::OpenWrite
          (MXFWriter *this,string *filename,WriterInfo *Info,AtmosDescriptor *ADesc,
          ui32_t HeaderSize)

{
  h__Writer *this_00;
  Dictionary *d;
  ILogSink *this_01;
  undefined4 in_register_00000084;
  uint in_R9D;
  
  if (*(int *)(ADesc[2].super_DCDataDescriptor.AssetID + 0xc) == 2) {
    this_00 = (h__Writer *)operator_new(0x780);
    d = AtmosSMPTEDict();
    h__Writer::h__Writer(this_00,d);
    if ((long *)filename->_M_string_length != (long *)0x0) {
      (**(code **)(*(long *)filename->_M_string_length + 8))();
    }
    filename->_M_string_length = (size_type)this_00;
    WriterInfo::operator=
              (&(this_00->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_Info
               ,(WriterInfo *)ADesc);
    h__Writer::OpenWrite
              ((h__Writer *)this,(string *)filename->_M_string_length,(ui32_t)Info,
               (AtmosDescriptor *)(ulong)in_R9D);
    if (-1 < *(int *)&this->_vptr_MXFWriter) {
      h__Writer::SetSourceStream
                ((h__Writer *)&stack0xffffffffffffff68,
                 (DCDataDescriptor *)filename->_M_string_length,
                 (byte_t *)CONCAT44(in_register_00000084,HeaderSize),(string *)ATMOS_ESSENCE_CODING,
                 (string *)ATMOS_PACKAGE_LABEL_abi_cxx11_);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
      if (-1 < *(int *)&this->_vptr_MXFWriter) {
        return this;
      }
    }
    filename->_M_string_length = 0;
  }
  else {
    this_01 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_01,"Atmos support requires LS_MXF_SMPTE\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::ATMOS::MXFWriter::OpenWrite(const std::string& filename, const WriterInfo& Info,
				       const AtmosDescriptor& ADesc, ui32_t HeaderSize)
{
  if ( Info.LabelSetType != LS_MXF_SMPTE )
  {
    DefaultLogSink().Error("Atmos support requires LS_MXF_SMPTE\n");
    return RESULT_FORMAT;
  }

  m_Writer = new h__Writer(&AtmosSMPTEDict());
  m_Writer->m_Info = Info;

  Result_t result = m_Writer->OpenWrite(filename, HeaderSize, ADesc);

  if ( ASDCP_SUCCESS(result) )
      result = m_Writer->SetSourceStream(ADesc, ATMOS_ESSENCE_CODING, ATMOS_PACKAGE_LABEL,
                                         ATMOS_DEF_LABEL);
  
  if ( ASDCP_FAILURE(result) )
    m_Writer.release();

  return result;
}